

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assign_inliner.cpp
# Opt level: O2

unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> __thiscall
verilogAST::AssignInliner::visit
          (AssignInliner *this,
          unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> *node)

{
  bool bVar1;
  int iVar2;
  _func_int **pp_Var3;
  mapped_type *pmVar4;
  undefined4 extraout_var;
  _func_int *p_Var5;
  long *in_RDX;
  _func_int **pp_Var6;
  string key;
  key_type local_70;
  string local_50;
  
  pp_Var6 = (_func_int **)*in_RDX;
  if ((pp_Var6 == (_func_int **)0x0) ||
     (pp_Var3 = (_func_int **)__dynamic_cast(pp_Var6,&Expression::typeinfo,&Identifier::typeinfo,0),
     pp_Var3 == (_func_int **)0x0)) {
    *in_RDX = 0;
    Transformer::visit(&this->super_Transformer,node);
    if (pp_Var6 == (_func_int **)0x0) {
      return (unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>)this;
    }
    p_Var5 = *pp_Var6;
  }
  else {
    *in_RDX = 0;
    (**(code **)*pp_Var3)(&local_70,pp_Var3);
    std::__cxx11::string::string((string *)&local_50,(string *)&local_70);
    bVar1 = can_inline((AssignInliner *)node,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (bVar1) {
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
                             *)(node + 0xd),&local_70);
      iVar2 = (*(((pmVar4->_M_t).
                  super___uniq_ptr_impl<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>
                  .super__Head_base<0UL,_verilogAST::Expression_*,_false>._M_head_impl)->super_Node)
                ._vptr_Node[3])();
      (*(code *)(((node->_M_t).
                  super___uniq_ptr_impl<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>
                  .super__Head_base<0UL,_verilogAST::Expression_*,_false>._M_head_impl)->super_Node)
                ._vptr_Node)(this,node);
      if ((long *)CONCAT44(extraout_var,iVar2) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x10))();
      }
    }
    else {
      (this->super_Transformer)._vptr_Transformer = pp_Var3;
      pp_Var3 = (_func_int **)0x0;
    }
    std::__cxx11::string::~string((string *)&local_70);
    if (pp_Var3 == (_func_int **)0x0) {
      return (unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>)this;
    }
    p_Var5 = *pp_Var3;
    pp_Var6 = pp_Var3;
  }
  (**(code **)(p_Var5 + 0x10))(pp_Var6);
  return (__uniq_ptr_data<verilogAST::Expression,_std::default_delete<verilogAST::Expression>,_true,_true>
          )(__uniq_ptr_data<verilogAST::Expression,_std::default_delete<verilogAST::Expression>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Expression> AssignInliner::visit(
    std::unique_ptr<Expression> node) {
  if (auto ptr = dynamic_cast<Identifier*>(node.get())) {
    node.release();
    std::unique_ptr<Identifier> id(ptr);
    std::string key = id->toString();
    if (this->can_inline(key)) {
      return this->visit(assign_map[key]->clone());
    }
    return id;
  }
  return Transformer::visit(std::move(node));
}